

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::DvpVerifyDynamicAllocation
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer)

{
  BufferDesc *Args;
  int iVar1;
  pointer pMVar2;
  Uint64 UVar3;
  Int32 IVar4;
  char (*in_RCX) [32];
  ulong uVar5;
  char (*in_R8) [94];
  string msg;
  Uint64 local_38;
  
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5cce7f,
               (char (*) [19])in_RCX);
    in_RCX = (char (*) [32])0x8f1;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8f1);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((pBuffer->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    if ((pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.Usage != USAGE_DYNAMIC) {
      FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BuffDesc.Usage == USAGE_DYNAMIC",in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8f7);
      std::__cxx11::string::~string((string *)&msg);
    }
    Args = &(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc;
    uVar5 = (ulong)(pBuffer->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
    if (uVar5 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                 (char **)"\' does not have dynamic buffer ID",(char (*) [34])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fa);
      std::__cxx11::string::~string((string *)&msg);
    }
    pMVar2 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)(((long)(this->m_MappedBuffers).
                               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x28)) {
      if (pMVar2[uVar5].Allocation.pDynamicMemMgr == (VulkanDynamicMemoryManager *)0x0) {
        local_38 = CONCAT71(local_38._1_7_,
                            (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId);
        FormatString<char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
                  (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' has not been mapped before its first use. Context Id: ",
                   (char (*) [57])&local_38,
                   (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)0x5b1110,
                   (char (*) [73])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x904);
        std::__cxx11::string::~string((string *)&msg);
      }
      UVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FrameNumber;
      if (pMVar2[uVar5].Allocation.dvpFrameNumber != UVar3) {
        local_38 = UVar3;
        FormatString<char[39],char_const*,char[12],unsigned_long,char[156]>
                  (&msg,(Diligent *)"Dynamic allocation of dynamic buffer \'",(char (*) [39])Args,
                   (char **)"\' in frame ",(char (*) [12])&local_38,
                   (unsigned_long *)
                   " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame."
                   ,(char (*) [156])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x907);
        std::__cxx11::string::~string((string *)&msg);
      }
      iVar1 = pMVar2[uVar5].DvpBufferUID;
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)pBuffer);
      if (iVar1 == IVar4) {
        return;
      }
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)pBuffer);
      local_38 = CONCAT44(local_38._4_4_,IVar4);
      FormatString<char[37],char_const*,char[10],int,char[37],int,char[106]>
                (&msg,(Diligent *)"Dynamic buffer ID mismatch. Buffer \'",(char (*) [37])Args,
                 (char **)"\' has ID ",(char (*) [10])&local_38,
                 (int *)" but the ID of the mapped buffer is ",
                 (char (*) [37])&pMVar2[uVar5].DvpBufferUID,
                 (int *)
                 ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped."
                 ,(char (*) [106])msg._M_dataplus._M_p);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x90a);
    }
    else {
      FormatString<char[17],char_const*,char[94]>
                (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                 (char **)
                 "\' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped."
                 ,in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fe);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpVerifyDynamicAllocation(const BufferVkImpl* pBuffer) const
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return;

    const BufferDesc& BuffDesc = pBuffer->GetDesc();
    VERIFY_EXPR(BuffDesc.Usage == USAGE_DYNAMIC);

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");

    if (DynamicBufferId >= m_MappedBuffers.size())
    {
        DEV_ERROR("Dynamic buffer '", BuffDesc.Name, "' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped.");
        return;
    }

    const MappedBuffer& MappedBuff = m_MappedBuffers[DynamicBufferId];
    DEV_CHECK_ERR(MappedBuff.Allocation.pDynamicMemMgr != nullptr, "Dynamic buffer '", BuffDesc.Name, "' has not been mapped before its first use. Context Id: ", GetContextId(),
                  ". Note: memory for dynamic buffers is allocated when a buffer is mapped.");

    DEV_CHECK_ERR(MappedBuff.Allocation.dvpFrameNumber == GetFrameNumber(), "Dynamic allocation of dynamic buffer '", BuffDesc.Name, "' in frame ", GetFrameNumber(),
                  " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame.");

    DEV_CHECK_ERR(MappedBuff.DvpBufferUID == pBuffer->GetUniqueID(), "Dynamic buffer ID mismatch. Buffer '", BuffDesc.Name, "' has ID ", pBuffer->GetUniqueID(), " but the ID of the mapped buffer is ",
                  MappedBuff.DvpBufferUID, ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped.");
}